

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_bio.cc
# Opt level: O0

int anon_unknown.dwarf_2b::AsyncBioMethodType(void)

{
  int iVar1;
  anon_class_1_0_00000001 local_9;
  
  if ((anonymous_namespace)::AsyncBioMethodType()::type == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::AsyncBioMethodType()::type);
    if (iVar1 != 0) {
      AsyncBioMethodType::type = AsyncBioMethodType::anon_class_1_0_00000001::operator()(&local_9);
      __cxa_guard_release(&(anonymous_namespace)::AsyncBioMethodType()::type);
    }
  }
  return AsyncBioMethodType::type;
}

Assistant:

static int AsyncBioMethodType() {
  static int type = [] {
    int idx = BIO_get_new_index();
    BSSL_CHECK(idx > 0);
    return idx | BIO_TYPE_FILTER;
  }();
  return type;
}